

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

AppleSDK __thiscall cmMakefile::GetAppleSDKType(cmMakefile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  AppleSDK AVar5;
  long *plVar6;
  long lVar7;
  string sdkRoot;
  anon_struct_40_2_65dcf250 sdkDatabase [6];
  string local_188;
  long *local_168 [2];
  long local_158 [2];
  long *local_148;
  long local_140;
  long local_138;
  long lStack_130;
  string local_128;
  AppleSDK local_108 [2];
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  undefined4 local_e0;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined4 local_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined4 local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined4 local_68;
  long *local_60 [2];
  long local_50 [2];
  undefined4 local_40;
  
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  local_188._M_string_length = 0;
  local_188.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_128.field_2;
  local_128._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"CMAKE_OSX_SYSROOT","");
  GetSafeDefinition(this,&local_128);
  std::__cxx11::string::_M_assign((string *)&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::LowerCase(&local_128,&local_188);
  std::__cxx11::string::operator=((string *)&local_188,(string *)&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  local_128._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"appletvos","");
  local_108[0] = AppleTVOS;
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"appletvsimulator","");
  local_e0 = 4;
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"iphoneos","");
  local_b8 = 1;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"iphonesimulator","");
  local_90 = 2;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"watchos","");
  local_68 = 5;
  plVar6 = local_50;
  local_60[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"watchsimulator","");
  local_40 = 6;
  lVar7 = 0;
  do {
    lVar2 = std::__cxx11::string::find
                      ((char *)&local_188,*(ulong *)((long)&local_128._M_dataplus._M_p + lVar7),0);
    if (lVar2 == 0) {
LAB_00184845:
      AVar5 = *(AppleSDK *)((long)local_108 + lVar7);
      goto LAB_0018484d;
    }
    local_168[0] = local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"/","");
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_168,
                                *(ulong *)((long)&local_128._M_dataplus._M_p + lVar7));
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_138 = *plVar4;
      lStack_130 = plVar3[3];
      local_148 = &local_138;
    }
    else {
      local_138 = *plVar4;
      local_148 = (long *)*plVar3;
    }
    local_140 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    lVar2 = std::__cxx11::string::find((char *)&local_188,(ulong)local_148,0);
    if (local_148 != &local_138) {
      operator_delete(local_148,local_138 + 1);
    }
    if (local_168[0] != local_158) {
      operator_delete(local_168[0],local_158[0] + 1);
    }
    if (lVar2 != -1) goto LAB_00184845;
    lVar7 = lVar7 + 0x28;
  } while (lVar7 != 0xf0);
  AVar5 = MacOS;
LAB_0018484d:
  lVar7 = -0xf0;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -5;
    lVar7 = lVar7 + 0x28;
  } while (lVar7 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,
                    CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                             local_188.field_2._M_local_buf[0]) + 1);
  }
  return AVar5;
}

Assistant:

cmMakefile::AppleSDK cmMakefile::GetAppleSDKType() const
{
  std::string sdkRoot;
  sdkRoot = this->GetSafeDefinition("CMAKE_OSX_SYSROOT");
  sdkRoot = cmSystemTools::LowerCase(sdkRoot);

  struct
  {
    std::string name;
    AppleSDK sdk;
  } const sdkDatabase[]{
    { "appletvos", AppleSDK::AppleTVOS },
    { "appletvsimulator", AppleSDK::AppleTVSimulator },
    { "iphoneos", AppleSDK::IPhoneOS },
    { "iphonesimulator", AppleSDK::IPhoneSimulator },
    { "watchos", AppleSDK::WatchOS },
    { "watchsimulator", AppleSDK::WatchSimulator },
  };

  for (auto const& entry : sdkDatabase) {
    if (sdkRoot.find(entry.name) == 0 ||
        sdkRoot.find(std::string("/") + entry.name) != std::string::npos) {
      return entry.sdk;
    }
  }

  return AppleSDK::MacOS;
}